

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_Node * UA_NodeStore_getCopy(UA_NodeStore *ns,UA_NodeId *nodeid)

{
  UA_NodeStoreEntry *pUVar1;
  UA_StatusCode UVar2;
  UA_NodeStoreEntry **ppUVar3;
  UA_NodeStoreEntry *entry_00;
  UA_NodeStoreEntry *new;
  UA_NodeStoreEntry *entry;
  UA_NodeStoreEntry **slot;
  UA_NodeId *nodeid_local;
  UA_NodeStore *ns_local;
  
  ppUVar3 = findNode(ns,nodeid);
  if (ppUVar3 == (UA_NodeStoreEntry **)0x0) {
    ns_local = (UA_NodeStore *)0x0;
  }
  else {
    pUVar1 = *ppUVar3;
    entry_00 = instantiateEntry((pUVar1->node).nodeClass);
    if (entry_00 == (UA_NodeStoreEntry *)0x0) {
      ns_local = (UA_NodeStore *)0x0;
    }
    else {
      UVar2 = UA_Node_copyAnyNodeClass(&pUVar1->node,&entry_00->node);
      if (UVar2 == 0) {
        entry_00->orig = pUVar1;
        ns_local = (UA_NodeStore *)&entry_00->node;
      }
      else {
        deleteEntry(entry_00);
        ns_local = (UA_NodeStore *)0x0;
      }
    }
  }
  return (UA_Node *)ns_local;
}

Assistant:

UA_Node *
UA_NodeStore_getCopy(UA_NodeStore *ns, const UA_NodeId *nodeid) {
    UA_NodeStoreEntry **slot = findNode(ns, nodeid);
    if(!slot)
        return NULL;
    UA_NodeStoreEntry *entry = *slot;
    UA_NodeStoreEntry *new = instantiateEntry(entry->node.nodeClass);
    if(!new)
        return NULL;
    if(UA_Node_copyAnyNodeClass(&entry->node, &new->node) != UA_STATUSCODE_GOOD) {
        deleteEntry(new);
        return NULL;
    }
    new->orig = entry; // store the pointer to the original
    return &new->node;
}